

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O0

__m128i * qP_word(int8_t *read_num,int8_t *mat,int32_t readLen,int32_t n)

{
  short sVar1;
  int iVar2;
  __m128i *palVar3;
  int local_48;
  int local_44;
  int32_t segNum;
  int32_t j;
  int32_t i;
  int32_t nt;
  int16_t *t;
  __m128i *vProfile;
  int32_t segLen;
  int32_t n_local;
  int32_t readLen_local;
  int8_t *mat_local;
  int8_t *read_num_local;
  
  iVar2 = (readLen + 7) / 8;
  palVar3 = (__m128i *)malloc((long)(n * iVar2) << 4);
  _i = palVar3;
  for (j = 0; j < n; j = j + 1) {
    for (segNum = 0; segNum < iVar2; segNum = segNum + 1) {
      local_44 = segNum;
      for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
        if (local_44 < readLen) {
          sVar1 = (short)mat[j * n + (int)read_num[local_44]];
        }
        else {
          sVar1 = 0;
        }
        *(short *)*_i = sVar1;
        local_44 = iVar2 + local_44;
        _i = (__m128i *)((long)*_i + 2);
      }
    }
  }
  return palVar3;
}

Assistant:

static __m128i* qP_word (const int8_t* read_num,
				  const int8_t* mat,
				  const int32_t readLen,
				  const int32_t n) {

	int32_t segLen = (readLen + 7) / 8;
	__m128i* vProfile = (__m128i*)malloc(n * segLen * sizeof(__m128i));
	int16_t* t = (int16_t*)vProfile;
	int32_t nt, i, j;
	int32_t segNum;

	/* Generate query profile rearrange query sequence & calculate the weight of match/mismatch */
	for (nt = 0; LIKELY(nt < n); nt ++) {
		for (i = 0; i < segLen; i ++) {
			j = i;
			for (segNum = 0; LIKELY(segNum < 8) ; segNum ++) {
				*t++ = j>= readLen ? 0 : mat[nt * n + read_num[j]];
				j += segLen;
			}
		}
	}
	return vProfile;
}